

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> __thiscall
wabt::MakeUnique<wabt::BrTableExpr,wabt::Location&>(wabt *this,Location *args)

{
  BrTableExpr *this_00;
  
  this_00 = (BrTableExpr *)operator_new(0xa0);
  BrTableExpr::BrTableExpr(this_00,args);
  *(BrTableExpr **)this = this_00;
  return (__uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}